

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_ctor_move(void)

{
  bool bVar1;
  undefined4 local_ac;
  size_type local_a8;
  undefined4 local_9c;
  size_type local_98 [2];
  undefined1 auStack_88 [8];
  circular_view<int,_18446744073709551615UL> clone;
  undefined4 local_5c;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 auStack_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)auStack_38,
             (value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::empty
                    ((circular_view<int,_18446744073709551615UL> *)auStack_38);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x56,"void api_dynamic_suite::dynamic_ctor_move()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::full
                    ((circular_view<int,_18446744073709551615UL> *)auStack_38);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x57,"void api_dynamic_suite::dynamic_ctor_move()",!bVar1);
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)auStack_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x58,"void api_dynamic_suite::dynamic_ctor_move()",local_48,&local_4c);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::capacity
                       ((circular_view<int,_18446744073709551615UL> *)auStack_38);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x59,"void api_dynamic_suite::dynamic_ctor_move()",&local_58,&local_5c);
  clone.member.cap = span.member.cap;
  clone.member.size = span.member.size;
  auStack_88 = auStack_38;
  clone.member.data = span.member.data;
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::empty
                    ((circular_view<int,_18446744073709551615UL> *)auStack_88);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5b,"void api_dynamic_suite::dynamic_ctor_move()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::full
                    ((circular_view<int,_18446744073709551615UL> *)auStack_88);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5c,"void api_dynamic_suite::dynamic_ctor_move()",(bool)(bVar1 - 1U & 1));
  local_98[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)auStack_88);
  local_9c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5d,"void api_dynamic_suite::dynamic_ctor_move()",local_98,&local_9c);
  local_a8 = vista::circular_view<int,_18446744073709551615UL>::capacity
                       ((circular_view<int,_18446744073709551615UL> *)auStack_88);
  local_ac = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x5e,"void api_dynamic_suite::dynamic_ctor_move()",&local_a8,&local_ac);
  return;
}

Assistant:

void dynamic_ctor_move()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
    circular_view<int> clone(std::move(span));
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
}